

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

void testExistingStreams(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  pointer pcVar3;
  long lVar4;
  undefined8 uVar5;
  Rgba RVar6;
  pointer pHVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long *plVar13;
  char *pcVar14;
  int *piVar15;
  ulong uVar16;
  void *pvVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  undefined4 uVar20;
  int h;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pcVar21;
  char *pcVar22;
  bool bVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Compression local_3b4;
  Header header;
  half hStack_39e;
  half hStack_39c;
  half hStack_39a;
  ulong local_398;
  ulong local_390;
  ulong *local_388;
  ulong *local_380;
  undefined8 local_378;
  RgbaOutputFile out_1;
  half hStack_366;
  half hStack_364;
  half hStack_362;
  ulong local_360;
  ulong local_358;
  ulong *local_350;
  ulong *local_348;
  undefined8 local_340;
  ulong local_338;
  StdOFStream ofs;
  undefined4 local_320;
  undefined1 uStack_31c;
  undefined1 uStack_31b;
  undefined2 uStack_31a;
  RgbaOutputFile out;
  half hStack_2ee;
  half hStack_2ec;
  half hStack_2ea;
  long local_2e0 [2];
  Rgba local_2d0;
  int *local_2c8;
  void *local_2c0;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  string strEXRFile;
  MultiPartOutputFile out_4;
  ofstream os;
  filebuf local_230 [8];
  char local_228 [232];
  ios_base aiStack_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing reading and writing using existing streams",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  uVar5 = _hasWhiteLuminance;
  lVar4 = _VTT;
  local_3b4 = NO_COMPRESSION;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression: ",0xd);
    plVar13 = (long *)std::ostream::operator<<(&std::cout,local_3b4);
    std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
    std::ostream::put((char)plVar13);
    std::ostream::flush();
    pcVar14 = (char *)operator_new__(0x37158);
    anon_unknown.dwarf_1574b9::fillPixels1((Array2D<Imf_3_2::Rgba> *)0x77,(int)pcVar14,h);
    _out_1 = (Rgba)&local_358;
    pcVar3 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_1,pcVar3,pcVar3 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&out_1);
    RVar6 = _out_1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based file:",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)RVar6);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,RVar6._0_4_);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar6);
    _out = 0;
    hStack_2ee._h = 0;
    hStack_2ec._h = 0;
    hStack_2ea._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_3b4);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,(OStream *)&ofs,&header,WRITE_RGBA,iVar10);
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar14,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out);
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar4;
    *(undefined8 *)(&os + *(long *)(lVar4 + -0x18)) = uVar5;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,RVar6._0_4_);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&header,(ifstream *)&os,(char *)RVar6);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&header,iVar10);
    piVar15 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    uVar11 = piVar15[3] - iVar12;
    local_2c8 = (int *)(ulong)uVar11;
    uVar11 = uVar11 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar15[1]);
    cVar9 = Imf_3_2::isLossyCompression(local_3b4);
    if (cVar9 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < (int)local_2c8) {
        pcVar21 = pcVar14 + 6;
        lVar25 = (long)pvVar17 + 6;
        uVar28 = 0;
        do {
          if (-1 < (int)lVar30) {
            uVar16 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x149,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14a,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14b,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x14c,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar16 = uVar16 + 1;
            } while ((uVar31 & 0xffffffff) != uVar16);
          }
          uVar28 = uVar28 + 1;
          pcVar21 = pcVar21 + 0x3b8;
          lVar25 = lVar25 + uVar31 * 8;
        } while (uVar28 != uVar11);
      }
    }
    operator_delete__(pvVar17);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&header);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1574b9::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar6);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar10);
    piVar15 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    uVar11 = piVar15[3] - iVar12;
    local_2c8 = (int *)(ulong)uVar11;
    uVar11 = uVar11 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar15[1]);
    cVar9 = Imf_3_2::isLossyCompression(local_3b4);
    if (cVar9 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < (int)local_2c8) {
        pcVar21 = pcVar14 + 6;
        lVar25 = (long)pvVar17 + 6;
        uVar28 = 0;
        do {
          if (-1 < (int)lVar30) {
            uVar16 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x168,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x169,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16a,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x16b,
                              "void (anonymous namespace)::writeReadScanLines(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar16 = uVar16 + 1;
            } while ((uVar31 & 0xffffffff) != uVar16);
          }
          uVar28 = uVar28 + 1;
          pcVar21 = pcVar21 + 0x3b8;
          lVar25 = lVar25 + uVar31 * 8;
        } while (uVar28 != uVar11);
      }
    }
    operator_delete__(pvVar17);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    anon_unknown.dwarf_1574b9::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove((char *)RVar6);
    if (_out_1 != (Rgba)&local_358) {
      operator_delete((void *)_out_1,local_358 + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based stringstream:",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    strEXRFile._M_dataplus._M_p = (pointer)&strEXRFile.field_2;
    strEXRFile._M_string_length = 0;
    strEXRFile.field_2._M_local_buf[0] = '\0';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    _header = 0;
    hStack_39e._h = 0;
    hStack_39c._h = 0;
    hStack_39a._h = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out_1,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,iVar10);
    Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out_1,(ulong)pcVar14,1);
    Imf_3_2::RgbaOutputFile::writePixels((int)(Rgba *)&out_1);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&strEXRFile,(string *)&header);
    if (_header != (Rgba)&local_390) {
      operator_delete((void *)_header,local_390 + 1);
    }
    Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out_1);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&ofs,(IStream *)&os,iVar10);
    piVar15 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    iVar24 = piVar15[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::RgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&ofs,piVar15[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar24) {
      pcVar21 = pcVar14 + 6;
      lVar25 = (long)pvVar17 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar30) {
          uVar16 = 0;
          do {
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x2ff,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x300,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x301,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x302,
                            "void (anonymous namespace)::writeReadScanLines(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar16 = uVar16 + 1;
          } while ((uVar31 & 0xffffffff) != uVar16);
        }
        uVar28 = uVar28 + 1;
        pcVar21 = pcVar21 + 0x3b8;
        lVar25 = lVar25 + uVar31 * 8;
      } while (uVar28 != uVar11);
    }
    operator_delete__(pvVar17);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    testExistingStreams();
    _out_1 = (Rgba)&local_358;
    pcVar3 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out_1,pcVar3,pcVar3 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&out_1);
    RVar6 = _out_1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tiled file:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)RVar6);
    std::ofstream::ofstream(&os);
    std::filebuf::open((char *)local_230,RVar6._0_4_);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar6);
    _out = 0;
    hStack_2ee._h = 0;
    hStack_2ec._h = 0;
    hStack_2ea._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out,1.0,INCREASING_Y,local_3b4);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&ofs,&header,WRITE_RGBA,0x14,0x14,ONE_LEVEL,
               ROUND_DOWN,iVar10);
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar14,1);
    iVar24 = (int)(Rgba *)&out;
    iVar10 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar24);
    iVar12 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar24);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar24,0,iVar10 + -1,0,iVar12 + -1);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header(&header);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar4;
    *(undefined8 *)(&os + *(long *)(lVar4 + -0x18)) = uVar5;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    std::filebuf::open(local_228,RVar6._0_4_);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)RVar6);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&header,(IStream *)&ofs,iVar10);
    piVar15 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    iVar24 = piVar15[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&header,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    iVar10 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&header);
    iVar12 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&header);
    Imf_3_2::TiledRgbaInputFile::readTiles((int)&header,0,iVar10 + -1,0,iVar12 + -1);
    cVar9 = Imf_3_2::isLossyCompression(local_3b4);
    if (cVar9 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar24) {
        pcVar21 = pcVar14 + 6;
        lVar25 = (long)pvVar17 + 6;
        uVar28 = 0;
        do {
          if (-1 < (int)lVar30) {
            uVar16 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x29f,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2a0,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2a1,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2a2,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar16 = uVar16 + 1;
            } while ((uVar31 & 0xffffffff) != uVar16);
          }
          uVar28 = uVar28 + 1;
          pcVar21 = pcVar21 + 0x3b8;
          lVar25 = lVar25 + uVar31 * 8;
        } while (uVar28 != uVar11);
      }
    }
    operator_delete__(pvVar17);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1574b9::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)RVar6);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar10);
    piVar15 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    iVar24 = piVar15[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    iVar10 = Imf_3_2::TiledRgbaInputFile::numXTiles((int)&ofs);
    iVar12 = Imf_3_2::TiledRgbaInputFile::numYTiles((int)&ofs);
    Imf_3_2::TiledRgbaInputFile::readTiles((int)&ofs,0,iVar10 + -1,0,iVar12 + -1);
    cVar9 = Imf_3_2::isLossyCompression(local_3b4);
    if (cVar9 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
      if (-1 < iVar24) {
        pcVar21 = pcVar14 + 6;
        lVar25 = (long)pvVar17 + 6;
        uVar28 = 0;
        do {
          if (-1 < (int)lVar30) {
            uVar16 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2be,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2bf,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c0,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x2c1,
                              "void (anonymous namespace)::writeReadTiles(const char *, int, int, Compression, const Array2D<Rgba> &)"
                             );
              }
              uVar16 = uVar16 + 1;
            } while ((uVar31 & 0xffffffff) != uVar16);
          }
          uVar28 = uVar28 + 1;
          pcVar21 = pcVar21 + 0x3b8;
          lVar25 = lVar25 + uVar31 * 8;
        } while (uVar28 != uVar11);
      }
    }
    operator_delete__(pvVar17);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    anon_unknown.dwarf_1574b9::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove((char *)RVar6);
    if (_out_1 != (Rgba)&local_358) {
      operator_delete((void *)_out_1,local_358 + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"tiled stringstream:",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    _header = (Rgba)&local_390;
    local_398 = 0;
    local_390 = local_390 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    _out_1 = 0;
    hStack_366._h = 0;
    hStack_364._h = 0;
    hStack_362._h = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&out_1,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              ((TiledRgbaOutputFile *)&out,(OStream *)&os,(Header *)&ofs,WRITE_RGBA,0x14,0x14,
               ONE_LEVEL,ROUND_DOWN,iVar10);
    Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pcVar14,1);
    iVar24 = (int)(Rgba *)&out;
    iVar10 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar24);
    iVar12 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar24);
    Imf_3_2::TiledRgbaOutputFile::writeTiles(iVar24,0,iVar10 + -1,0,iVar12 + -1);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&header,(string *)&out_1);
    if (_out_1 != (Rgba)&local_358) {
      operator_delete((void *)_out_1,local_358 + 1);
    }
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
    Imf_3_2::Header::~Header((Header *)&ofs);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
              ((TiledRgbaInputFile *)&ofs,(IStream *)&os,iVar10);
    piVar15 = (int *)Imf_3_2::TiledRgbaInputFile::dataWindow();
    iVar10 = *piVar15;
    lVar30 = (long)piVar15[2] - (long)iVar10;
    uVar31 = lVar30 + 1;
    iVar12 = piVar15[1];
    iVar24 = piVar15[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    Imf_3_2::TiledRgbaInputFile::setFrameBuffer
              ((Rgba *)&ofs,(long)pvVar17 + (long)iVar10 * -8 + (long)-iVar12 * uVar31 * 8,1);
    iVar27 = (int)(Rgba *)&ofs;
    iVar10 = Imf_3_2::TiledRgbaInputFile::numXTiles(iVar27);
    iVar12 = Imf_3_2::TiledRgbaInputFile::numYTiles(iVar27);
    Imf_3_2::TiledRgbaInputFile::readTiles(iVar27,0,iVar10 + -1,0,iVar12 + -1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", comparing",0xb);
    if (-1 < iVar24) {
      pcVar21 = pcVar14 + 6;
      lVar25 = (long)pvVar17 + 6;
      uVar28 = 0;
      do {
        if (-1 < (int)lVar30) {
          uVar16 = 0;
          do {
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -6 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -6) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].r == p1[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d0,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -4 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -4) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].g == p1[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d1,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + -2 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8 + -2) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].b == p1[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d2,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar25 + uVar16 * 8) * 4);
            pfVar1 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(pcVar21 + uVar16 * 8) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
              __assert_fail("p2[y][x].a == p1[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                            ,0x3d3,
                            "void (anonymous namespace)::writeReadTiles(int, int, const Array2D<Rgba> &)"
                           );
            }
            uVar16 = uVar16 + 1;
          } while ((uVar31 & 0xffffffff) != uVar16);
        }
        uVar28 = uVar28 + 1;
        pcVar21 = pcVar21 + 0x3b8;
        lVar25 = lVar25 + uVar31 * 8;
      } while (uVar28 != uVar11);
    }
    operator_delete__(pvVar17);
    Imf_3_2::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&ofs);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    iVar10 = extraout_EDX;
    if (_header != (Rgba)&local_390) {
      operator_delete((void *)_header,local_390 + 1);
      iVar10 = extraout_EDX_00;
    }
    anon_unknown.dwarf_1574b9::fillPixels1((Array2D<Imf_3_2::Rgba> *)0x77,(int)pcVar14,iVar10);
    _out = (Rgba)local_2e0;
    pcVar3 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,pcVar3,pcVar3 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&out);
    local_2d0 = _out;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart file:",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    remove((char *)local_2d0);
    std::ofstream::ofstream(&os);
    RVar6 = local_2d0;
    std::filebuf::open((char *)local_230,local_2d0._0_4_);
    Imf_3_2::StdOFStream::StdOFStream(&ofs,&os,(char *)RVar6);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              (&headers,2,(allocator_type *)&header);
    _out_1 = 0;
    hStack_366._h = 0;
    hStack_364._h = 0;
    hStack_362._h = 0;
    Imf_3_2::Header::Header(&header,0x77,0xed,1.0,(Vec2 *)&out_1,1.0,INCREASING_Y,local_3b4);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start,&header);
    Imf_3_2::Header::~Header(&header);
    local_398 = 5;
    local_390 = CONCAT26(local_390._6_2_,0x3174726170);
    _header = (Rgba)&local_390;
    Imf_3_2::Header::setName
              ((string *)
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    if (_header != (Rgba)&local_390) {
      operator_delete((void *)_header,local_390 + 1);
    }
    pcVar21 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd903);
    pcVar21 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd916);
    pcVar21 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd929);
    pcVar21 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&header,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1c771e);
    Imf_3_2::Header::setType
              ((string *)
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + 0x38,
               headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start);
    local_398 = 5;
    local_390 = CONCAT26(local_390._6_2_,0x3274726170);
    _header = (Rgba)&local_390;
    Imf_3_2::Header::setName
              ((string *)
               (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                _M_impl.super__Vector_impl_data._M_start + 0x38));
    if (_header != (Rgba)&local_390) {
      operator_delete((void *)_header,local_390 + 1);
    }
    pHVar7 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile(&out_4,(OStream *)&ofs,pHVar7,2,false,iVar10);
    local_360 = local_360 & 0xffffffff00000000;
    local_358 = 0;
    local_350 = &local_360;
    local_340 = 0;
    local_348 = local_350;
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar14,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar14 + 2,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar14 + 4,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd929);
    pcVar21 = pcVar14 + 6;
    Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar21,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1c771e);
    iVar10 = 0;
    bVar8 = true;
    do {
      bVar23 = bVar8;
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&header,&out_4,iVar10);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&header);
      iVar10 = 1;
      bVar8 = false;
    } while (bVar23);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&out_1);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out_4);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
    Imf_3_2::StdOFStream::~StdOFStream(&ofs);
    _os = lVar4;
    *(undefined8 *)(&os + *(long *)(lVar4 + -0x18)) = uVar5;
    std::filebuf::~filebuf(local_230);
    std::ios_base::~ios_base(aiStack_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    std::ifstream::ifstream(&os);
    RVar6 = local_2d0;
    std::filebuf::open(local_228,local_2d0._0_4_);
    Imf_3_2::StdIFStream::StdIFStream((StdIFStream *)&ofs,(ifstream *)&os,(char *)RVar6);
    iVar10 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&headers,(IStream *)&ofs,iVar10,true);
    iVar10 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar10 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d5,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar10 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar12 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar32._4_4_ = iVar10;
    auVar32._0_4_ = iVar10;
    auVar32._8_4_ = iVar12;
    auVar32._12_4_ = iVar12;
    iVar10 = movmskpd(uVar20,auVar32);
    if ((iVar10 != 3) ||
       (iVar10 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar12 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar33._4_4_ = iVar10, auVar33._0_4_ = iVar10, auVar33._8_4_ = iVar12,
       auVar33._12_4_ = iVar12, iVar10 = movmskpd((int)puVar19,auVar33), iVar10 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x1d7,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&headers);
    local_2c8 = (int *)Imf_3_2::Header::dataWindow();
    iVar10 = local_2c8[2];
    lVar30 = (long)*local_2c8;
    uVar31 = (iVar10 - lVar30) + 1;
    iVar12 = local_2c8[1];
    iVar24 = local_2c8[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    local_360 = local_360 & 0xffffffff00000000;
    local_358 = 0;
    local_350 = &local_360;
    local_340 = 0;
    lVar25 = (long)-iVar12 * uVar31;
    uVar28 = uVar31 * 8;
    local_348 = local_350;
    local_338 = uVar31;
    local_2c0 = pvVar17;
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8),8,uVar28,1,1
               ,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 2),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 4),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&header,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 6),8,uVar28
               ,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&out_1,(Slice *)0x1c771e);
    uVar31 = local_338 & 0xffffffff;
    local_338 = (long)local_2c0 + 6;
    iVar12 = 0;
    bVar8 = true;
    do {
      bVar23 = bVar8;
      Imf_3_2::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&headers,iVar12);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&header);
      Imf_3_2::InputPart::readPixels((int)&header,local_2c8[1]);
      cVar9 = Imf_3_2::isLossyCompression(local_3b4);
      if (cVar9 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar12);
        if (-1 < iVar24) {
          uVar26 = 0;
          uVar16 = local_338;
          pcVar22 = pcVar21;
          do {
            if (-1 < (int)(iVar10 - lVar30)) {
              uVar29 = 0;
              do {
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -6 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -6) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20b,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -4 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -4) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20c,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -2 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -2) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20d,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x20e,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar29 = uVar29 + 1;
              } while (uVar31 != uVar29);
            }
            uVar26 = uVar26 + 1;
            pcVar22 = pcVar22 + 0x3b8;
            uVar16 = uVar16 + uVar28;
          } while (uVar26 != uVar11);
        }
      }
      iVar12 = 1;
      bVar8 = false;
    } while (bVar23);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&out_1);
    operator_delete__(local_2c0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&headers);
    Imf_3_2::StdIFStream::~StdIFStream((StdIFStream *)&ofs);
    std::ifstream::~ifstream(&os);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (memory-mapped)",0x19);
    anon_unknown.dwarf_1574b9::MMIFStream::MMIFStream((MMIFStream *)&os,(char *)local_2d0);
    iVar10 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out_1,(IStream *)&os,iVar10,true);
    iVar10 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar10 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21a,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out_1);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&out_1);
    puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar10 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar12 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar34._4_4_ = iVar10;
    auVar34._0_4_ = iVar10;
    auVar34._8_4_ = iVar12;
    auVar34._12_4_ = iVar12;
    iVar10 = movmskpd(uVar20,auVar34);
    if ((iVar10 != 3) ||
       (iVar10 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar12 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar35._4_4_ = iVar10, auVar35._0_4_ = iVar10, auVar35._8_4_ = iVar12,
       auVar35._12_4_ = iVar12, iVar10 = movmskpd((int)puVar19,auVar35), iVar10 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x21c,
                    "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out_1);
    local_2c8 = (int *)Imf_3_2::Header::dataWindow();
    iVar10 = local_2c8[2];
    lVar30 = (long)*local_2c8;
    uVar31 = (iVar10 - lVar30) + 1;
    iVar12 = local_2c8[1];
    iVar24 = local_2c8[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    local_398 = local_398 & 0xffffffff00000000;
    local_390 = 0;
    local_388 = &local_398;
    local_378 = 0;
    lVar25 = (long)-iVar12 * uVar31;
    uVar28 = uVar31 * 8;
    local_380 = local_388;
    local_338 = uVar31;
    local_2c0 = pvVar17;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8),8,uVar28,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 2),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 4),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 6),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c771e);
    uVar31 = local_338 & 0xffffffff;
    local_338 = (long)local_2c0 + 6;
    iVar12 = 0;
    bVar8 = true;
    do {
      bVar23 = bVar8;
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out_1,iVar12);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,local_2c8[1]);
      cVar9 = Imf_3_2::isLossyCompression(local_3b4);
      if (cVar9 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,", comparing pt ",0xf);
        std::ostream::operator<<(&std::cout,iVar12);
        if (-1 < iVar24) {
          uVar26 = 0;
          uVar16 = local_338;
          pcVar22 = pcVar21;
          do {
            if (-1 < (int)(iVar10 - lVar30)) {
              uVar29 = 0;
              do {
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -6 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -6) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x250,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -4 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -4) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x251,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + -2 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -2) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x252,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                fVar2 = *(float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(uVar16 + uVar29 * 8) * 4);
                pfVar1 = (float *)(_imath_half_to_float_table +
                                  (ulong)*(ushort *)(pcVar22 + uVar29 * 8) * 4);
                if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                                ,0x253,
                                "void (anonymous namespace)::writeReadMultiPart(const char *, int, int, Compression, const Array2D<Rgba> &)"
                               );
                }
                uVar29 = uVar29 + 1;
              } while (uVar31 != uVar29);
            }
            uVar26 = uVar26 + 1;
            pcVar22 = pcVar22 + 0x3b8;
            uVar16 = uVar16 + uVar28;
          } while (uVar26 != uVar11);
        }
      }
      iVar12 = 1;
      bVar8 = false;
    } while (bVar23);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    operator_delete__(local_2c0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out_1);
    anon_unknown.dwarf_1574b9::MMIFStream::~MMIFStream((MMIFStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    remove((char *)local_2d0);
    if (_out != (Rgba)local_2e0) {
      operator_delete((void *)_out,local_2e0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"scan-line based multipart stringstream:",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    _out_1 = (Rgba)&local_358;
    local_360 = 0;
    local_358 = local_358 & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    Imf_3_2::StdOSStream::StdOSStream((StdOSStream *)&os);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out,2,
               (allocator_type *)&ofs);
    _header = 0;
    hStack_39e._h = 0;
    hStack_39c._h = 0;
    hStack_39a._h = 0;
    Imf_3_2::Header::Header
              ((Header *)&ofs,0x77,0xed,1.0,(Vec2 *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
    Imf_3_2::Header::operator=((Header *)_out,(Header *)&ofs);
    Imf_3_2::Header::~Header((Header *)&ofs);
    uStack_31c = 0x31;
    local_320 = 0x74726170;
    uStack_31b = 0;
    _ofs = (Rgba)&local_320;
    Imf_3_2::Header::setName((string *)_out);
    if (_ofs != (Rgba)&local_320) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_31a,CONCAT15(uStack_31b,CONCAT14(uStack_31c,local_320))) + 1);
    }
    pcVar22 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd903);
    pcVar22 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd916);
    pcVar22 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1bd929);
    pcVar22 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&ofs,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1c771e);
    Imf_3_2::Header::setType((string *)_out);
    Imf_3_2::Header::operator=((Header *)((long)_out + 0x38),(Header *)_out);
    uStack_31c = 0x32;
    local_320 = 0x74726170;
    uStack_31b = 0;
    _ofs = (Rgba)&local_320;
    Imf_3_2::Header::setName((string *)((long)_out + 0x38));
    if (_ofs != (Rgba)&local_320) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_31a,CONCAT15(uStack_31b,CONCAT14(uStack_31c,local_320))) + 1);
    }
    RVar6 = _out;
    iVar10 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              ((MultiPartOutputFile *)&headers,(OStream *)&os,(Header *)RVar6,2,false,iVar10);
    local_398 = local_398 & 0xffffffff00000000;
    local_390 = 0;
    local_388 = &local_398;
    local_378 = 0;
    local_380 = local_388;
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,pcVar14,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,pcVar14 + 2,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,pcVar14 + 4,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice((Slice *)&ofs,HALF,pcVar21,8,0x3b8,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c771e);
    iVar10 = 0;
    bVar8 = true;
    do {
      bVar23 = bVar8;
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&ofs,(MultiPartOutputFile *)&headers,iVar10);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&ofs);
      iVar10 = 1;
      bVar8 = false;
    } while (bVar23);
    Imf_3_2::StdOSStream::str_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&out_1,(string *)&ofs);
    if (_ofs != (Rgba)&local_320) {
      operator_delete((void *)_ofs,
                      CONCAT26(uStack_31a,CONCAT15(uStack_31b,CONCAT14(uStack_31c,local_320))) + 1);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&headers);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)&out);
    Imf_3_2::StdOSStream::~StdOSStream((StdOSStream *)&os);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", reading",9);
    Imf_3_2::StdISStream::StdISStream((StdISStream *)&os);
    Imf_3_2::StdISStream::clear();
    Imf_3_2::StdISStream::str((string *)&os);
    iVar10 = Imf_3_2::globalThreadCount();
    uVar20 = 1;
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&out,(IStream *)&os,iVar10,true);
    iVar10 = Imf_3_2::MultiPartInputFile::parts();
    if (iVar10 != 2) {
      __assert_fail("in.parts () == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35d,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out);
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    Imf_3_2::MultiPartInputFile::header((int)&out);
    puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar10 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar12 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar36._4_4_ = iVar10;
    auVar36._0_4_ = iVar10;
    auVar36._8_4_ = iVar12;
    auVar36._12_4_ = iVar12;
    iVar10 = movmskpd(uVar20,auVar36);
    if ((iVar10 != 3) ||
       (iVar10 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar12 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar37._4_4_ = iVar10, auVar37._0_4_ = iVar10, auVar37._8_4_ = iVar12,
       auVar37._12_4_ = iVar12, iVar10 = movmskpd((int)puVar19,auVar37), iVar10 != 3)) {
      __assert_fail("in.header (0).dataWindow () == in.header (1).dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                    ,0x35f,
                    "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                   );
    }
    Imf_3_2::MultiPartInputFile::header((int)&out);
    local_2c8 = (int *)Imf_3_2::Header::dataWindow();
    iVar10 = local_2c8[2];
    lVar30 = (long)*local_2c8;
    uVar31 = (iVar10 - lVar30) + 1;
    iVar12 = local_2c8[1];
    iVar24 = local_2c8[3] - iVar12;
    uVar11 = iVar24 + 1;
    uVar16 = (long)(int)uVar11 * uVar31;
    uVar28 = uVar16 * 8;
    if (0x1fffffffffffffff < uVar16) {
      uVar28 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar28);
    local_398 = local_398 & 0xffffffff00000000;
    local_390 = 0;
    local_388 = &local_398;
    local_378 = 0;
    lVar25 = (long)-iVar12 * uVar31;
    uVar28 = uVar31 * 8;
    local_380 = local_388;
    local_338 = uVar31;
    local_2d0 = (Rgba)pvVar17;
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8),8,uVar28,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd903);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 2),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd916);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 4),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1bd929);
    Imf_3_2::Slice::Slice
              ((Slice *)&ofs,HALF,(char *)((long)pvVar17 + lVar30 * -8 + lVar25 * 8 + 6),8,uVar28,1,
               1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&header,(Slice *)0x1c771e);
    uVar31 = local_338 & 0xffffffff;
    local_338 = (long)local_2d0 + 6;
    iVar12 = 0;
    bVar8 = true;
    do {
      bVar23 = bVar8;
      Imf_3_2::InputPart::InputPart((InputPart *)&ofs,(MultiPartInputFile *)&out,iVar12);
      Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&ofs);
      Imf_3_2::InputPart::readPixels((int)&ofs,local_2c8[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,", comparing pt ",0xf);
      std::ostream::operator<<(&std::cout,iVar12);
      if (-1 < iVar24) {
        uVar26 = 0;
        uVar16 = local_338;
        pcVar22 = pcVar21;
        do {
          if (-1 < (int)(iVar10 - lVar30)) {
            uVar29 = 0;
            do {
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(uVar16 + -6 + uVar29 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -6) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x391,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(uVar16 + -4 + uVar29 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -4) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x392,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(uVar16 + -2 + uVar29 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar22 + uVar29 * 8 + -2) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x393,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              fVar2 = *(float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(uVar16 + uVar29 * 8) * 4);
              pfVar1 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(pcVar22 + uVar29 * 8) * 4);
              if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testExistingStreams.cpp"
                              ,0x394,
                              "void (anonymous namespace)::writeReadMultiPart(int, int, const Array2D<Rgba> &)"
                             );
              }
              uVar29 = uVar29 + 1;
            } while (uVar31 != uVar29);
          }
          uVar26 = uVar26 + 1;
          pcVar22 = pcVar22 + 0x3b8;
          uVar16 = uVar16 + uVar28;
        } while (uVar26 != uVar11);
      }
      iVar12 = 1;
      bVar8 = false;
    } while (bVar23);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&header);
    operator_delete__((void *)local_2d0);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&out);
    Imf_3_2::StdISStream::~StdISStream((StdISStream *)&os);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (_out_1 != (Rgba)&local_358) {
      operator_delete((void *)_out_1,local_358 + 1);
    }
    operator_delete__(pcVar14);
    local_3b4 = local_3b4 + RLE_COMPRESSION;
    if (local_3b4 == NUM_COMPRESSION_METHODS) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testExistingStreams (const std::string& tempDir)
{
    try
    {
        cout << "Testing reading and writing using existing streams" << endl;

        const int W = 119;
        const int H = 237;

        for (int compression = 0; compression < NUM_COMPRESSION_METHODS;
             ++compression)
        {
            cout << "compression: " << compression << endl;

            Array2D<Rgba> p1 (H, W);

            fillPixels1 (p1, W, H);
            writeReadScanLines (
               (tempDir + "imf_test_streams.exr").c_str (),
               W,
               H,
               static_cast<Compression>(compression),
               p1);
            writeReadScanLines (W, H, p1);

            fillPixels2 (p1, W, H);
            writeReadTiles (
               (tempDir + "imf_test_streams2.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadTiles (W, H, p1);

            fillPixels1 (p1, W, H);
            writeReadMultiPart (
               (tempDir + "imf_test_streams3.exr").c_str (),
               W,
               H,
                static_cast<Compression> (compression),
               p1);
            writeReadMultiPart (W, H, p1);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}